

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_FARRAY_GET(function *fn,int A,int B,int C,_Bool omitArrayGetRangeCheck,int pc)

{
  int pc_local;
  _Bool omitArrayGetRangeCheck_local;
  int C_local;
  int B_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  emit_reg(fn,"rb",B);
  emit_reg_or_k(fn,"rc",C);
  membuff_add_string(&fn->body,"ukey = (lua_Unsigned)(ivalue(rc));\n");
  membuff_add_string(&fn->body,"t = arrvalue(rb);");
  membuff_add_string(&fn->body,"nptr = (lua_Number *)t->data;\n");
  if (!omitArrayGetRangeCheck) {
    membuff_add_string(&fn->body,"if (ukey < (lua_Unsigned)(t->len)) {\n");
  }
  membuff_add_string(&fn->body," setfltvalue(ra, nptr[ukey]);\n");
  if (!omitArrayGetRangeCheck) {
    membuff_add_string(&fn->body,"} else {\n");
    membuff_add_fstring(&fn->body," error_code = %d;\n",0xd);
    membuff_add_string(&fn->body," goto Lraise_error;\n");
    membuff_add_string(&fn->body,"}\n");
  }
  return;
}

Assistant:

static void emit_FARRAY_GET(struct function *fn, int A, int B, int C, bool omitArrayGetRangeCheck, int pc) {
  (void)pc;
  emit_reg(fn, "ra", A);
  emit_reg(fn, "rb", B);
  emit_reg_or_k(fn, "rc", C);
  membuff_add_string(&fn->body, "ukey = (lua_Unsigned)(ivalue(rc));\n");
  membuff_add_string(&fn->body, "t = arrvalue(rb);");
  membuff_add_string(&fn->body, "nptr = (lua_Number *)t->data;\n");
  if (!omitArrayGetRangeCheck) {
    membuff_add_string(&fn->body, "if (ukey < (lua_Unsigned)(t->len)) {\n");
  }
  membuff_add_string(&fn->body, " setfltvalue(ra, nptr[ukey]);\n");
  if (!omitArrayGetRangeCheck) {
    membuff_add_string(&fn->body, "} else {\n");
#if GOTO_ON_ERROR
    membuff_add_fstring(&fn->body, " error_code = %d;\n", Error_array_out_of_bounds);
    membuff_add_string(&fn->body, " goto Lraise_error;\n");
#else
    membuff_add_fstring(&fn->body, " raviV_raise_error(L, %d);\n", Error_array_out_of_bounds);
#endif
    membuff_add_string(&fn->body, "}\n");
  }
}